

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessmanager.cpp
# Opt level: O2

void QNetworkAccessManager::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  undefined8 *puVar2;
  InterfaceType *pIVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_00179fa6:
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_00179fd0:
        *puVar2 = pIVar3;
        goto switchD_00179e8c_default;
      }
      break;
    case 5:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_00179fc9:
        pIVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00179fd0;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
      break;
    case 7:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00179fa6;
      break;
    case 8:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00179fc9;
    }
    *puVar2 = 0;
    goto switchD_00179e8c_default;
  }
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QNetworkAccessManager::*)(QNetworkProxy_const&,QAuthenticator*)>
                      ((QtMocHelpers *)_a,(void **)proxyAuthenticationRequired,0,0);
    if ((((!bVar1) &&
         (bVar1 = QtMocHelpers::
                  indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QAuthenticator*)>
                            ((QtMocHelpers *)_a,(void **)authenticationRequired,0,1), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*)>
                           ((QtMocHelpers *)_a,(void **)finished,0,2), !bVar1)) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*)>
                           ((QtMocHelpers *)_a,(void **)encrypted,0,3), !bVar1 &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QList<QSslError>const&)>
                           ((QtMocHelpers *)_a,(void **)sslErrors,0,4), !bVar1)))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QtMocHelpers::
        indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QSslPreSharedKeyAuthenticator*)>
                  ((QtMocHelpers *)_a,(void **)preSharedKeyAuthenticationRequired,0,5);
        return;
      }
      goto LAB_0017a157;
    }
    goto switchD_00179e8c_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00179e8c_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      proxyAuthenticationRequired((QNetworkAccessManager *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      authenticationRequired((QNetworkAccessManager *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      finished((QNetworkAccessManager *)_o,*_a[1]);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      encrypted((QNetworkAccessManager *)_o,*_a[1]);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      sslErrors((QNetworkAccessManager *)_o,*_a[1],(QList<QSslError> *)_a[2]);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      preSharedKeyAuthenticationRequired((QNetworkAccessManager *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 6:
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    supportedSchemesImplementation((QStringList *)&local_28,(QNetworkAccessManager *)_o);
    if ((QArrayDataPointer<QString> *)*_a != (QArrayDataPointer<QString> *)0x0) {
      QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)*_a,&local_28);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  default:
switchD_00179e8c_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QNetworkAccessManagerPrivate::_q_replySslErrors
                (*(QNetworkAccessManagerPrivate **)(_o + 8),(QList<QSslError> *)_a[1]);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QNetworkAccessManagerPrivate::_q_replyPreSharedKeyAuthenticationRequired
                (*(QNetworkAccessManagerPrivate **)(_o + 8),*_a[1]);
      return;
    }
  }
LAB_0017a157:
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessManager *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 3: _t->encrypted((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 4: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 6: { QStringList _r = _t->supportedSchemesImplementation();
            if (_a[0]) *reinterpret_cast< QStringList*>(_a[0]) = std::move(_r); }  break;
        case 7: _t->d_func()->_q_replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 8: _t->d_func()->_q_replyPreSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QNetworkAccessManager::proxyAuthenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QAuthenticator * )>(_a, &QNetworkAccessManager::authenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::finished, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::encrypted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , const QList<QSslError> & )>(_a, &QNetworkAccessManager::sslErrors, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkAccessManager::preSharedKeyAuthenticationRequired, 5))
            return;
    }
}